

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

int SSE4x4_C(uint8_t *a,uint8_t *b)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  int count;
  long lVar15;
  int iVar16;
  short sVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  
  lVar15 = 0;
  iVar16 = 0;
  do {
    uVar1 = *(undefined4 *)(a + lVar15);
    uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar8;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar8;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar8;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
    uVar1 = *(undefined4 *)(b + lVar15);
    uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar9;
    auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar6[8] = (char)((uint)uVar1 >> 0x10);
    auVar6._0_8_ = uVar9;
    auVar6[9] = 0;
    auVar6._10_3_ = auVar5._10_3_;
    auVar11._5_8_ = 0;
    auVar11._0_5_ = auVar6._8_5_;
    auVar7[4] = (char)((uint)uVar1 >> 8);
    auVar7._0_4_ = (int)uVar9;
    auVar7[5] = 0;
    auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
    auVar17._0_4_ = (int)uVar8 - (int)uVar9;
    auVar17._4_4_ = auVar4._4_4_ - auVar7._4_4_;
    auVar17._8_4_ = auVar3._8_4_ - auVar6._8_4_;
    auVar17._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10);
    auVar17 = packssdw(auVar17,auVar17);
    auVar19 = pmulhw(auVar17,auVar17);
    sVar18 = auVar17._6_2_ * auVar17._6_2_;
    iVar14 = CONCAT22(auVar19._6_2_,sVar18);
    Var13 = CONCAT64(CONCAT42(iVar14,auVar19._4_2_),CONCAT22(auVar17._4_2_ * auVar17._4_2_,sVar18));
    auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
    auVar12._2_2_ = auVar19._2_2_;
    auVar12._0_2_ = auVar17._2_2_ * auVar17._2_2_;
    iVar16 = iVar14 + auVar12._0_4_ +
             (int)((unkuint10)Var13 >> 0x10) +
             CONCAT22(auVar19._0_2_,auVar17._0_2_ * auVar17._0_2_) + iVar16;
    lVar15 = lVar15 + 0x20;
  } while ((int)lVar15 != 0x80);
  return iVar16;
}

Assistant:

static int SSE4x4_C(const uint8_t* a, const uint8_t* b) {
  return GetSSE(a, b, 4, 4);
}